

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  Lit LVar1;
  value_type vVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Lit p;
  ostream *poVar7;
  Lit *pLVar8;
  Lit *pLVar9;
  reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  OnlineProofChecker *pOVar13;
  Clause *pCVar14;
  reference pvVar15;
  reference this_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  vec<Minisat::Lit> *in_RSI;
  byte *in_RDI;
  size_t k;
  size_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *list;
  int i_3;
  int hit;
  Clause *c;
  size_t i;
  CRef ref;
  Lit smallest;
  int i_2;
  int smallestIndex;
  bool found;
  int i_1;
  Lit l;
  undefined8 in_stack_fffffffffffffe28;
  Ref r;
  MarkArray *in_stack_fffffffffffffe30;
  vec<Minisat::Lit> *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  ostream *in_stack_fffffffffffffe48;
  ostream *in_stack_fffffffffffffe50;
  OnlineProofChecker *in_stack_fffffffffffffe60;
  ostream *local_a8;
  ulong local_a0;
  int local_88;
  int local_68;
  OnlineProofChecker *local_50;
  uint local_44;
  int local_34;
  int local_2c;
  int local_20;
  bool local_1;
  
  if (3 < *(int *)(in_RDI + 0xf8)) {
    std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ");
    poVar7 = operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    printState(in_stack_fffffffffffffe60);
  }
  iVar5 = vec<Minisat::Lit>::size(in_RSI);
  if ((iVar5 == 0) || ((*in_RDI & 1) == 0)) {
    local_1 = true;
  }
  else {
    iVar5 = vec<Minisat::Lit>::size(in_RSI);
    if (iVar5 == 1) {
      pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,0);
      LVar1.x = pLVar8->x;
      bVar4 = false;
      for (local_20 = 0; iVar5 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x30)),
          local_20 < iVar5; local_20 = local_20 + 1) {
        pLVar8 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x30),local_20);
        bVar3 = Lit::operator==(pLVar8,LVar1);
        if (bVar3) {
          iVar5 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x30));
          pLVar8 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x30),iVar5 + -1);
          pLVar9 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0x30),local_20);
          pLVar9->x = pLVar8->x;
          vec<Minisat::Lit>::pop((vec<Minisat::Lit> *)(in_RDI + 0x30));
          bVar4 = true;
          break;
        }
      }
      if (bVar4) {
        if (1 < *(int *)(in_RDI + 0xf8)) {
          std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
          poVar7 = operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      MarkArray::nextStep(in_stack_fffffffffffffe30);
      local_2c = 0;
      pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,0);
      toInt((Lit)pLVar8->x);
      MarkArray::setCurrentStep
                (in_stack_fffffffffffffe30,(uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      for (local_34 = 1; iVar5 = vec<Minisat::Lit>::size(in_RSI), local_34 < iVar5;
          local_34 = local_34 + 1) {
        pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,local_34);
        toInt((Lit)pLVar8->x);
        MarkArray::setCurrentStep
                  (in_stack_fffffffffffffe30,(uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,local_34);
        iVar5 = toInt((Lit)pLVar8->x);
        pvVar10 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x40),(long)iVar5);
        sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
        pvVar10 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x40),(long)local_2c);
        sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
        if (sVar11 < sVar12) {
          local_2c = local_34;
        }
      }
      pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,local_2c);
      LVar1.x = pLVar8->x;
      local_44 = 0xffffffff;
      local_50 = (OnlineProofChecker *)0x0;
      while( true ) {
        iVar5 = toInt(LVar1);
        pvVar10 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x40),(long)iVar5);
        pOVar13 = (OnlineProofChecker *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
        if (pOVar13 <= local_50) break;
        iVar5 = toInt(LVar1);
        pvVar10 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                *)(in_RDI + 0x40),(long)iVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (pvVar10,(size_type)local_50);
        pCVar14 = ClauseAllocator::operator[]
                            ((ClauseAllocator *)in_stack_fffffffffffffe30,
                             (Ref)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        iVar5 = Clause::size(pCVar14);
        iVar6 = vec<Minisat::Lit>::size(in_RSI);
        if (iVar5 == iVar6) {
          for (local_68 = 0; iVar5 = Clause::size(pCVar14), local_68 < iVar5;
              local_68 = local_68 + 1) {
            p = Clause::operator[](pCVar14,local_68);
            toInt(p);
            bVar4 = MarkArray::isCurrentStep
                              (in_stack_fffffffffffffe30,
                               (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            if (((bVar4 ^ 0xffU) & 1) != 0) break;
          }
          iVar5 = Clause::size(pCVar14);
          if (iVar5 <= local_68) {
            iVar5 = toInt(LVar1);
            pvVar10 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x40),(long)iVar5);
            pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,(size_type)local_50);
            local_44 = *pvVar15;
            iVar5 = toInt(LVar1);
            pvVar10 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x40),(long)iVar5);
            iVar5 = toInt(LVar1);
            this_00 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x40),(long)iVar5);
            sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
            pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,sVar11 - 1);
            vVar2 = *pvVar15;
            iVar5 = toInt(LVar1);
            pvVar10 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x40),(long)iVar5);
            pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,(size_type)local_50);
            *pvVar15 = vVar2;
            iVar5 = toInt(LVar1);
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)(in_RDI + 0x40),(long)iVar5);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x156aa0);
            local_50 = (OnlineProofChecker *)0xffffffffffffffff;
            break;
          }
        }
        local_50 = (OnlineProofChecker *)&local_50->field_0x1;
      }
      this_01 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)(in_RDI + 0x40);
      iVar5 = toInt(LVar1);
      pvVar10 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](this_01,(long)iVar5);
      pOVar13 = (OnlineProofChecker *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
      if ((local_50 == pOVar13) || (local_44 == 0xffffffff)) {
        if (1 < *(int *)(in_RDI + 0xf8)) {
          std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ");
          poVar7 = operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          std::operator<<(poVar7," from list of literal ");
          poVar7 = operator<<(in_stack_fffffffffffffe50,(Lit *)in_stack_fffffffffffffe48);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        printState(in_stack_fffffffffffffe60);
        local_1 = false;
      }
      else {
        local_88 = 0;
        while( true ) {
          iVar5 = vec<Minisat::Lit>::size(in_RSI);
          r = (Ref)((ulong)in_stack_fffffffffffffe28 >> 0x20);
          if (iVar5 <= local_88) break;
          if (local_88 != local_2c) {
            pLVar8 = vec<Minisat::Lit>::operator[](in_RSI,local_88);
            iVar5 = toInt((Lit)pLVar8->x);
            pOVar13 = (OnlineProofChecker *)
                      std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(in_RDI + 0x40),(long)iVar5);
            for (local_a0 = 0;
                sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13),
                local_a0 < sVar11; local_a0 = local_a0 + 1) {
              pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13,
                                   local_a0);
              if (*pvVar15 == local_44) {
                in_stack_fffffffffffffe60 = pOVar13;
                sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13);
                pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffffe60,sVar11 - 1);
                vVar2 = *pvVar15;
                pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13,
                                     local_a0);
                *pvVar15 = vVar2;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x156cec);
                local_a0 = 0xffffffffffffffff;
                break;
              }
            }
            sVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13);
            if (local_a0 == sVar11) {
              if (1 < *(int *)(in_RDI + 0xf8)) {
                std::operator<<((ostream *)&std::cerr,"c could not remove clause ");
                poVar7 = operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
                in_stack_fffffffffffffe50 = std::operator<<(poVar7," from list of literal ");
                vec<Minisat::Lit>::operator[](in_RSI,local_88);
                poVar7 = operator<<(in_stack_fffffffffffffe50,(Lit *)in_stack_fffffffffffffe48);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              printState(in_stack_fffffffffffffe60);
              if (2 < *(int *)(in_RDI + 0xf8)) {
                in_stack_fffffffffffffe48 = std::operator<<((ostream *)&std::cerr,"c list for ");
                vec<Minisat::Lit>::operator[](in_RSI,local_88);
                poVar7 = operator<<(in_stack_fffffffffffffe50,(Lit *)in_stack_fffffffffffffe48);
                std::operator<<(poVar7," : ");
                local_a8 = (ostream *)0x0;
                while (in_stack_fffffffffffffe40 = local_a8,
                      poVar7 = (ostream *)
                               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                          pOVar13), in_stack_fffffffffffffe40 < poVar7) {
                  in_stack_fffffffffffffe38 =
                       (vec<Minisat::Lit> *)std::operator<<((ostream *)&std::cerr,"c ");
                  in_stack_fffffffffffffe30 = (MarkArray *)(in_RDI + 8);
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar13,
                             (size_type)local_a8);
                  ClauseAllocator::operator[]
                            ((ClauseAllocator *)in_stack_fffffffffffffe30,
                             (Ref)((ulong)in_stack_fffffffffffffe28 >> 0x20));
                  poVar7 = operator<<(in_stack_fffffffffffffe40,(Clause *)in_stack_fffffffffffffe38)
                  ;
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  local_a8 = local_a8 + 1;
                }
              }
            }
          }
          local_88 = local_88 + 1;
        }
        detachClause(local_50,(CRef)((ulong)this_01 >> 0x20));
        pCVar14 = ClauseAllocator::operator[]((ClauseAllocator *)in_stack_fffffffffffffe30,r);
        Clause::mark(pCVar14,1);
        ClauseAllocator::free((ClauseAllocator *)(in_RDI + 8),(void *)(ulong)local_44);
        if (1 < *(int *)(in_RDI + 0xf8)) {
          std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ");
          poVar7 = operator<<(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          poVar7 = std::operator<<(poVar7," which is internally ");
          ClauseAllocator::operator[]
                    ((ClauseAllocator *)in_stack_fffffffffffffe30,(Ref)((ulong)poVar7 >> 0x20));
          poVar7 = operator<<(in_stack_fffffffffffffe40,(Clause *)in_stack_fffffffffffffe38);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}